

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Boost::render(V2Boost *this,StereoSample *buf,int nsamples)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (this->enabled == true) {
    uVar1 = 0;
    uVar3 = (ulong)(uint)nsamples;
    if (nsamples < 1) {
      uVar3 = uVar1;
    }
    for (; uVar1 != 2; uVar1 = uVar1 + 1) {
      fVar4 = this->x2[uVar1];
      fVar5 = this->x1[uVar1];
      fVar7 = this->y2[uVar1];
      fVar8 = this->y1[uVar1];
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        fVar6 = buf[uVar2].field_0.l + 3.8146973e-06;
        fVar9 = ((fVar4 * this->b2 + this->b0 * fVar6 + this->b1 * fVar5) - this->a1 * fVar8) -
                fVar7 * this->a2;
        buf[uVar2].field_0.l = fVar9;
        fVar4 = fVar5;
        fVar5 = fVar6;
        fVar7 = fVar8;
        fVar8 = fVar9;
      }
      this->x1[uVar1] = fVar5;
      this->x2[uVar1] = fVar4;
      this->y1[uVar1] = fVar8;
      this->y2[uVar1] = fVar7;
      buf = (StereoSample *)&(buf->field_0).r;
    }
  }
  return;
}

Assistant:

void render(StereoSample *buf, int nsamples)
    {
        if (!enabled)
            return;

        COVER("BOOST render");

        for (int ch=0; ch < 2; ch++)
        {
            float xm1 = x1[ch], xm2 = x2[ch];
            float ym1 = y1[ch], ym2 = y2[ch];

            for (int i=0; i < nsamples; i++)
            {
                float x = buf[i].ch[ch] + fcdcoffset;

                // Second-order IIR filter
                float y = b0*x + b1*xm1 + b2*xm2 - a1*ym1 - a2*ym2;
                ym2 = ym1; ym1 = y;
                xm2 = xm1; xm1 = x;

                buf[i].ch[ch] = y;
            }

            x1[ch] = xm1; x2[ch] = xm2;
            y1[ch] = ym1; y2[ch] = ym2;
        }
    }